

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O2

Direction __thiscall
gepard::StrokePathBuilder::LineAttributes::vectorCompare(LineAttributes *this,LineAttributes *line)

{
  Direction DVar1;
  Float FVar2;
  
  FVar2 = FloatPoint::cross(&this->unit,&line->unit);
  if (FVar2 <= 0.0) {
    if (0.0 <= FVar2) {
      DVar1 = -(uint)((this->unit).y + (line->unit).y == 0.0) & Reverse;
    }
    else {
      DVar1 = Negative;
    }
  }
  else {
    DVar1 = Positive;
  }
  return DVar1;
}

Assistant:

StrokePathBuilder::LineAttributes::Direction StrokePathBuilder::LineAttributes::vectorCompare(const LineAttributes* line) const
{
    const Float direction = unit.cross(line->unit);

    if (direction > 0.0)
        return Direction::Positive;
    if (direction < 0.0)
        return Direction::Negative;

    if (!(unit.y + line->unit.y))
        return Direction::Reverse;

    return Direction::Same;
}